

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

Image * __thiscall
pbrt::RGBFilm::GetImage
          (Image *__return_storage_ptr__,RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Bounds2i *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  ImageMetadata *pIVar7;
  Allocator alloc;
  Point2i resolution;
  long *plVar8;
  long lVar9;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Float local_c4;
  ImageMetadata *local_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *pcStack_a8;
  code *pcStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [2];
  ColorEncodingHandle local_38;
  
  local_c4 = splatScale;
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
        ,0x225,"Converting image to RGB and computing final weighted pixel values");
  }
  iVar2 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  iVar3 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  bVar1 = this->writeFP16;
  local_98._0_8_ = local_88;
  iVar4 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar5 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"R","");
  local_78[0] = local_68;
  local_c0 = metadata;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"G","");
  plVar8 = local_48;
  local_58[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"B","");
  local_38.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar2 - iVar5;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar3 - iVar4;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  Image::Image(__return_storage_ptr__,Float - bVar1,resolution,channels,&local_38,alloc);
  this_00 = &(this->super_FilmBase).pixelBounds;
  lVar9 = -0x60;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_b8 = (undefined8 *)0x0;
  uStack_b0 = 0;
  pcStack_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8 = (undefined8 *)operator_new(0x18);
  *local_b8 = this;
  local_98._0_8_ = &local_b8;
  local_b8[1] = &local_c4;
  local_b8[2] = __return_storage_ptr__;
  pcStack_a0 = std::
               _Function_handler<void_(pbrt::Point2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp:553:32)>
               ::_M_invoke;
  pcStack_a8 = std::
               _Function_handler<void_(pbrt::Point2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp:553:32)>
               ::_M_manager;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_88._8_8_ =
       std::
       _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:173:27)>
       ::_M_invoke;
  local_88._0_8_ =
       std::
       _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:173:27)>
       ::_M_manager;
  ParallelFor2D((pbrt *)this_00,(Bounds2i *)local_98,
                (function<void_(pbrt::Bounds2<int>)> *)
                std::
                _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:173:27)>
                ::_M_invoke);
  pIVar7 = local_c0;
  if ((code *)local_88._0_8_ != (code *)0x0) {
    (*(code *)local_88._0_8_)(local_98,local_98,3);
  }
  if (pcStack_a8 != (code *)0x0) {
    (*pcStack_a8)(&local_b8,&local_b8,3);
  }
  if ((pIVar7->pixelBounds).set == true) {
    (pIVar7->pixelBounds).set = false;
  }
  TVar6 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>;
  *(Tuple2<pbrt::Point2,_int> *)&(pIVar7->pixelBounds).optionalValue =
       (this_00->pMin).super_Tuple2<pbrt::Point2,_int>;
  *(Tuple2<pbrt::Point2,_int> *)((long)&(pIVar7->pixelBounds).optionalValue + 8) = TVar6;
  (pIVar7->pixelBounds).set = true;
  if ((pIVar7->fullResolution).set == true) {
    (pIVar7->fullResolution).set = false;
  }
  (pIVar7->fullResolution).optionalValue =
       *(aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)
        &(this->super_FilmBase).fullResolution.super_Tuple2<pbrt::Point2,_int>;
  (pIVar7->fullResolution).set = true;
  (pIVar7->colorSpace).optionalValue =
       (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
       )this->colorSpace;
  (pIVar7->colorSpace).set = true;
  return __return_storage_ptr__;
}

Assistant:

Image RGBFilm::GetImage(ImageMetadata *metadata, Float splatScale) {
    // Convert image to RGB and compute final pixel values
    LOG_VERBOSE("Converting image to RGB and computing final weighted pixel values");
    PixelFormat format = writeFP16 ? PixelFormat::Half : PixelFormat::Float;
    Image image(format, Point2i(pixelBounds.Diagonal()), {"R", "G", "B"});

    ParallelFor2D(pixelBounds, [&](Point2i p) {
        RGB rgb = GetPixelRGB(p, splatScale);

        Point2i pOffset(p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y);
        image.SetChannels(pOffset, {rgb[0], rgb[1], rgb[2]});
    });

    metadata->pixelBounds = pixelBounds;
    metadata->fullResolution = fullResolution;
    metadata->colorSpace = colorSpace;

    return image;
}